

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O0

streamsize __thiscall
xe::xml::EscapeStreambuf::xsputn(EscapeStreambuf *this,char *s,streamsize count)

{
  ostream *poVar1;
  char *__s;
  ulong uVar2;
  char *entity;
  streamsize inPos;
  streamsize numWritten;
  streamsize count_local;
  char *s_local;
  EscapeStreambuf *this_local;
  
  inPos = 0;
  entity = (char *)0x0;
  do {
    if (count <= (long)entity) {
      this_local = (EscapeStreambuf *)count;
      if (inPos < count) {
        std::ostream::write((char *)this->m_dst,(long)(s + inPos));
        uVar2 = std::ios::fail();
        if ((uVar2 & 1) != 0) {
          this_local = (EscapeStreambuf *)inPos;
        }
      }
      return (streamsize)this_local;
    }
    __s = getEscapeEntity(s[(long)entity]);
    if (__s != (char *)0x0) {
      if (inPos < (long)entity) {
        std::ostream::write((char *)this->m_dst,(long)(s + inPos));
        uVar2 = std::ios::fail();
        if ((uVar2 & 1) != 0) {
          return inPos;
        }
      }
      poVar1 = this->m_dst;
      strlen(__s);
      std::ostream::write((char *)poVar1,(long)__s);
      inPos = (streamsize)(entity + 1);
    }
    entity = entity + 1;
  } while( true );
}

Assistant:

std::streamsize EscapeStreambuf::xsputn (const char* s, std::streamsize count)
{
	std::streamsize	numWritten = 0;

	for (std::streamsize inPos = 0; inPos < count; inPos++)
	{
		const char* entity = getEscapeEntity(s[inPos]);

		if (entity)
		{
			// Flush data prior to entity.
			if (inPos > numWritten)
			{
				m_dst.write(s + numWritten, inPos-numWritten);
				if (m_dst.fail())
					return numWritten;
			}

			// Flush entity value
			m_dst.write(entity, (std::streamsize)strlen(entity));

			numWritten = inPos+1;
		}
	}

	if (numWritten < count)
	{
		m_dst.write(s + numWritten, count-numWritten);
		if (m_dst.fail())
			return numWritten;
	}

	return count;
}